

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item-wear.c
# Opt level: O3

_Bool borg_backup_swap(int p)

{
  int iVar1;
  int iVar2;
  borg_item_conflict *pbVar3;
  wchar_t wVar4;
  wchar_t wVar5;
  int iVar6;
  wchar_t wVar7;
  char *what;
  long lVar8;
  borg_item *pbVar9;
  int *piVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  if (borg.trait[0x6d] == 0) {
    if (borg.trait[0x6c] != 0) {
      return false;
    }
    if (300 < borg.time_this_panel) {
      return false;
    }
    wVar5 = L'\0';
    if (armour_swap == 0 && weapon_swap == 0) {
      return false;
    }
    if (armour_swap == 0) {
      bVar11 = true;
      bVar12 = true;
      bVar13 = true;
    }
    else {
      iVar6 = borg.trait[0x4d];
      iVar1 = borg.trait[0x4e];
      iVar2 = borg.trait[0x56];
      lVar8 = (long)armour_swap + -1;
      pbVar9 = (borg_item *)(borg_items + lVar8);
      wVar4 = borg_wield_slot(pbVar9);
      if (wVar4 < L'\0') {
        return false;
      }
      memcpy(borg_items + (uint)wVar4,safe_items + lVar8,0x388);
      pbVar3 = borg_items;
      borg_items[(uint)wVar4].iqty = '\x01';
      pbVar3[lVar8].iqty = pbVar3[lVar8].iqty + 0xff;
      borg_notice(false);
      wVar5 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
      memcpy(borg_items + (uint)wVar4,safe_items + (uint)wVar4,0x388);
      memcpy(borg_items + lVar8,safe_items + lVar8,0x388);
      bVar11 = iVar1 == 0;
      if ((!bVar11) && (borg.trait[0x4e] == 0)) {
        wVar5 = L'✏';
      }
      bVar12 = iVar6 == 0;
      if ((((!bVar12) && (borg.trait[0x4d] == 0)) && (borg.trait[0x4b] == 0)) &&
         ((borg.trait[0x4c] == 0 && (borg.trait[0x39] < 100)))) {
        wVar5 = L'✏';
      }
      bVar13 = iVar2 == 0;
      if (((!bVar13) && (borg.trait[0x56] == 0)) && (borg.trait[0x39] < 100)) {
        wVar5 = L'✏';
      }
      borg_notice(true);
      if ((((player->opts).opt[0x1e] == true) && (pbVar9->art_idx != '\0')) &&
         (pbVar9->ident == false)) {
        wVar5 = L'✏';
      }
      if ((pbVar9->cursed == true) && (pbVar9->uncursable == false)) {
        wVar5 = L'✏';
      }
    }
    if (weapon_swap == 0) {
      wVar4 = L'\0';
    }
    else {
      iVar6 = weapon_swap + -1;
      pbVar9 = (borg_item *)(borg_items + iVar6);
      wVar7 = borg_wield_slot(pbVar9);
      if (wVar7 < L'\0') {
        return false;
      }
      memcpy(borg_items + (uint)wVar7,safe_items + iVar6,0x388);
      pbVar3 = borg_items;
      borg_items[(uint)wVar7].iqty = '\x01';
      pbVar3[iVar6].iqty = pbVar3[iVar6].iqty + 0xff;
      borg_notice(false);
      wVar4 = borg_danger(borg.c.y,borg.c.x,L'\x01',true,false);
      if ((!bVar11) && (borg.trait[0x4e] == 0)) {
        wVar4 = L'✏';
      }
      if ((((!bVar12) && (borg.trait[0x4d] == 0)) && (borg.trait[0x4b] == 0)) &&
         ((borg.trait[0x4c] == 0 && (borg.trait[0x39] < 100)))) {
        wVar4 = L'✏';
      }
      if (((!bVar13) && (borg.trait[0x56] == 0)) && (borg.trait[0x39] < 100)) {
        wVar4 = L'✏';
      }
      memcpy(borg_items + (uint)wVar7,safe_items + (uint)wVar7,0x388);
      memcpy(borg_items + iVar6,safe_items + iVar6,0x388);
      borg_notice(true);
      if ((((player->opts).opt[0x1e] == true) && (pbVar9->art_idx != '\0')) &&
         (pbVar9->ident == false)) {
        wVar4 = L'✏';
      }
      if ((pbVar9->cursed == true) && (pbVar9->uncursable == false)) {
        wVar4 = L'✏';
      }
    }
    piVar10 = &weapon_swap;
    if (wVar4 < wVar5) {
      piVar10 = &armour_swap;
      wVar4 = wVar5;
    }
    if (wVar4 < p) {
      if (borg_fighting_unique == L'\0') {
        wVar5 = (int)(short)(avoidance - (avoidance >> 0xf)) >> 1;
      }
      else {
        wVar5 = (avoidance * 2) / 3;
      }
      if (wVar4 <= wVar5) {
        iVar6 = *piVar10;
        what = format("# Swapping backup.  (%ld < %d).",(long)wVar4,p);
        borg_note(what);
        borg_keypress(0x77);
        borg_keypress((int)(char)(&DAT_0027d74f)[iVar6]);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool borg_backup_swap(int p)
{
    int slot;
    int swap;

    int32_t b_p  = 0L;
    int32_t b_p1 = 0L;
    int32_t b_p2 = 0L;

    int i;

    int save_rconf  = 0;
    int save_rblind = 0;
    int save_fract  = 0;

    borg_item *item;

    bool fix = false;

    /* hack prevent the swap till you drop loop */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK])
        return false;

    /* Forbid if been sitting on level forever */
    /*    Just come back and work through the loop later */
    if (borg.time_this_panel > 300)
        return false;

    /* make sure we have an appropriate swap */
    if (!armour_swap && !weapon_swap)
        return false;

    if (armour_swap) {
        /* Save our normal condition */
        save_rconf  = borg.trait[BI_RCONF];
        save_rblind = borg.trait[BI_RBLIND];
        save_fract  = borg.trait[BI_FRACT];

        /* Check the items, first armour then weapon */
        i = armour_swap - 1;

        /* make sure it is not a -1 */
        if (i == -1)
            i = 0;

        /* get the item */
        item = &borg_items[i];

        /* Where does it go */
        slot = borg_wield_slot(item);

        /* safety check incase slot = -1 */
        if (slot < 0)
            return false;

        /* Wear new item */
        memcpy(&borg_items[slot], &safe_items[i], sizeof(borg_item));

        /* Only a single item */
        borg_items[slot].iqty = 1;

        /* Reduce the inventory quantity by one */
        borg_items[i].iqty--;

        /* Fix later */
        fix = true;

        /* Examine the benefits of the swap item */
        borg_notice(false);

        /* Evaluate the power with the new item worn */
        b_p1 = borg_danger(borg.c.y, borg.c.x, 1, true, false);

        /* Restore the old item */
        memcpy(&borg_items[slot], &safe_items[slot], sizeof(borg_item));

        /* Restore the new item */
        memcpy(&borg_items[i], &safe_items[i], sizeof(borg_item));

        /* Examine the critical skills */
        if ((save_rconf) && borg.trait[BI_RCONF] == 0)
            b_p1 = 9999;
        if ((save_rblind)
            && (!borg.trait[BI_RBLIND] && !borg.trait[BI_RLITE]
                && !borg.trait[BI_RDARK] && borg.trait[BI_SAV] < 100))
            b_p1 = 9999;
        if ((save_fract) && (!borg.trait[BI_FRACT] && borg.trait[BI_SAV] < 100))
            b_p1 = 9999;

        /* Restore bonuses */
        if (fix)
            borg_notice(true);

        /*  skip random artifact not star id'd  */
        if (OPT(player, birth_randarts) && item->art_idx && !item->ident)
            b_p1 = 9999;

        /* skip it if it has not been decursed */
        if (item->cursed && !item->uncursable)
            b_p1 = 9999;
    }

    /* Now we check the weapon */
    if (weapon_swap) {
        /* get the item */
        i = weapon_swap - 1;

        /* make sure it is not a -1 */
        if (i == -1)
            i = 0;

        item = &borg_items[i];

        /* Where does it go */
        slot = borg_wield_slot(item);

        /* safety check incase slot = -1 */
        if (slot < 0)
            return false;

        /* Wear new item */
        memcpy(&borg_items[slot], &safe_items[i], sizeof(borg_item));

        /* Only a single item */
        borg_items[slot].iqty = 1;

        /* Reduce the inventory quantity by one */
        borg_items[i].iqty--;

        /* Fix later */
        fix = true;

        /* Examine the inventory */
        borg_notice(false);

        /* Evaluate the power with the new item worn */
        b_p2 = borg_danger(borg.c.y, borg.c.x, 1, true, false);

        /* Examine the critical skills */
        /* Examine the critical skills */
        if ((save_rconf) && borg.trait[BI_RCONF] == 0)
            b_p2 = 9999;
        if ((save_rblind)
            && (!borg.trait[BI_RBLIND] && !borg.trait[BI_RLITE]
                && !borg.trait[BI_RDARK] && borg.trait[BI_SAV] < 100))
            b_p2 = 9999;
        if ((save_fract) && (!borg.trait[BI_FRACT] && borg.trait[BI_SAV] < 100))
            b_p2 = 9999;

        /* Restore the old item (empty) */
        memcpy(&borg_items[slot], &safe_items[slot], sizeof(borg_item));

        /* Restore the new item */
        memcpy(&borg_items[i], &safe_items[i], sizeof(borg_item));

        /* Restore bonuses */
        if (fix)
            borg_notice(true);

        /*  skip random artifact not star id'd  */
        if (OPT(player, birth_randarts) && item->art_idx && !item->ident)
            b_p2 = 9999;

        /* skip it if it has not been decursed */
        if (item->cursed && !item->uncursable)
            b_p2 = 9999;
    }

    /* Pass on the swap which yields the best result */
    if (b_p1 <= b_p2) {
        b_p  = b_p2;
        swap = weapon_swap - 1;
    } else {
        b_p  = b_p1;
        swap = armour_swap - 1;
    }

    /* good swap.  Make sure it helps a significant amount */
    if (p > b_p
        && b_p <= (borg_fighting_unique ? ((avoidance * 2) / 3)
                                        : (avoidance / 2))) {
        /* Log */
        borg_note(format("# Swapping backup.  (%ld < %d).", (long int)b_p, p));

        /* Wear it */
        borg_keypress('w');
        borg_keypress(all_letters_nohjkl[swap]);

        /* Did something */
        return true;
    }

    /* Nope */
    return false;
}